

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

ssize_t __thiscall directory::read(directory *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  char *pcVar2;
  reference pvVar3;
  undefined4 in_register_00000034;
  uint local_58;
  int i;
  allocator<unsigned_int> local_41;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  fpos<__mbstate_t> local_28;
  char *local_18;
  fstream *stream_local;
  directory *this_local;
  
  local_18 = (char *)CONCAT44(in_register_00000034,__fd);
  stream_local = (fstream *)this;
  std::fpos<__mbstate_t>::fpos(&local_28,0);
  std::istream::seekg((char *)CONCAT44(in_register_00000034,__fd),local_28._M_off,local_28._M_state)
  ;
  std::istream::read(local_18,(long)this);
  std::istream::read(local_18,(long)&this->bucket_size);
  uVar1 = this->bucket_size;
  std::allocator<unsigned_int>::allocator(&local_41);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_40,(ulong)uVar1,&local_41)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->bucket_ids,&local_40);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_40);
  std::allocator<unsigned_int>::~allocator(&local_41);
  for (local_58 = 0; pcVar2 = local_18, local_58 < this->bucket_size; local_58 = local_58 + 1) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->bucket_ids,(long)(int)local_58);
    std::istream::read(pcVar2,(long)pvVar3);
  }
  return (ulong)local_58;
}

Assistant:

void directory::read(std::fstream &stream) {
    stream.seekg(0);

    stream.read((char *) &depth, DEPTHS);
    stream.read((char *) &bucket_size, BUCKET_SIZE);
    this->bucket_ids = vector<uint32_t>(bucket_size);

    for (int i = 0; i < bucket_size; ++i) {
        stream.read((char *) &bucket_ids[i], BUCKET_ID);
    }
}